

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2f::BuildLogTestDuplicateVersionHeader::Run
          (BuildLogTestDuplicateVersionHeader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  LoadStatus LVar4;
  int iVar5;
  FILE *__s;
  LogEntry *pLVar6;
  int fail_count;
  int iVar7;
  string err;
  BuildLog log;
  string local_d0;
  string local_b0;
  BuildLog local_90;
  
  __s = fopen("BuildLogTest-tempfile","wb");
  fwrite("# ninja log v4\n",0xf,1,__s);
  fwrite("123\t456\t456\tout\tcommand\n",0x18,1,__s);
  fwrite("# ninja log v4\n",0xf,1,__s);
  fwrite("456\t789\t789\tout2\tcommand2\n",0x1a,1,__s);
  fclose(__s);
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  BuildLog::BuildLog(&local_90);
  pTVar2 = g_current_test;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"BuildLogTest-tempfile","");
  LVar4 = BuildLog::Load(&local_90,&local_d0,&local_b0);
  testing::Test::Check
            (pTVar2,LVar4 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
             ,0xcc,"log.Load(kTestFilename, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_b0);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0xcd,"\"\" == err");
  if (bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"out","");
    pLVar6 = BuildLog::LookupByOutput(&local_90,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = testing::Test::Check
                      (g_current_test,pLVar6 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0xd0,"e");
    if (((!bVar3) ||
        (bVar3 = testing::Test::Check
                           (g_current_test,pLVar6->start_time == 0x7b,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                            ,0xd1,"123 == e->start_time"), !bVar3)) ||
       (bVar3 = testing::Test::Check
                          (g_current_test,pLVar6->end_time == 0x1c8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xd2,"456 == e->end_time"), !bVar3)) goto LAB_0011dc64;
    bVar3 = testing::Test::Check
                      (g_current_test,pLVar6->mtime == 0x1c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0xd3,"456 == e->mtime");
    iVar5 = g_current_test->assertion_failures_;
    iVar7 = iVar5;
    if (bVar3) {
      AssertHash("command",pLVar6->command_hash);
      iVar7 = g_current_test->assertion_failures_;
      if (iVar5 == iVar7) {
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"out2","");
        pLVar6 = BuildLog::LookupByOutput(&local_90,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = testing::Test::Check
                          (g_current_test,pLVar6 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xd7,"e");
        if (((!bVar3) ||
            (bVar3 = testing::Test::Check
                               (g_current_test,pLVar6->start_time == 0x1c8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                ,0xd8,"456 == e->start_time"), !bVar3)) ||
           (bVar3 = testing::Test::Check
                              (g_current_test,pLVar6->end_time == 0x315,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                               ,0xd9,"789 == e->end_time"), !bVar3)) goto LAB_0011dc64;
        bVar3 = testing::Test::Check
                          (g_current_test,pLVar6->mtime == 0x315,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xda,"789 == e->mtime");
        iVar5 = g_current_test->assertion_failures_;
        iVar7 = iVar5;
        if (bVar3) {
          AssertHash("command2",pLVar6->command_hash);
          iVar7 = g_current_test->assertion_failures_;
          if (iVar5 == iVar7) goto LAB_0011dc6f;
        }
      }
    }
  }
  else {
LAB_0011dc64:
    iVar7 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar7 + 1;
LAB_0011dc6f:
  BuildLog::~BuildLog(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildLogTest, DuplicateVersionHeader) {
  // Old versions of ninja accidentally wrote multiple version headers to the
  // build log on Windows. This shouldn't crash, and the second version header
  // should be ignored.
  FILE* f = fopen(kTestFilename, "wb");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "123\t456\t456\tout\tcommand\n");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "456\t789\t789\tout2\tcommand2\n");
  fclose(f);

  string err;
  BuildLog log;
  EXPECT_TRUE(log.Load(kTestFilename, &err));
  ASSERT_EQ("", err);

  BuildLog::LogEntry* e = log.LookupByOutput("out");
  ASSERT_TRUE(e);
  ASSERT_EQ(123, e->start_time);
  ASSERT_EQ(456, e->end_time);
  ASSERT_EQ(456, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command", e->command_hash));

  e = log.LookupByOutput("out2");
  ASSERT_TRUE(e);
  ASSERT_EQ(456, e->start_time);
  ASSERT_EQ(789, e->end_time);
  ASSERT_EQ(789, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command2", e->command_hash));
}